

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# util.h
# Opt level: O2

int secp256k1_memcmp_var(void *s1,void *s2,size_t n)

{
  byte *pbVar1;
  byte *pbVar2;
  int iVar3;
  size_t i;
  
  i = 0;
  do {
    if (n == i) {
      return 0;
    }
    pbVar1 = (byte *)((long)s1 + i);
    pbVar2 = (byte *)((long)s2 + i);
    i = i + 1;
    iVar3 = (uint)*pbVar1 - (uint)*pbVar2;
  } while (iVar3 == 0);
  return iVar3;
}

Assistant:

static SECP256K1_INLINE int secp256k1_memcmp_var(const void *s1, const void *s2, size_t n) {
    const unsigned char *p1 = s1, *p2 = s2;
    size_t i;

    for (i = 0; i < n; i++) {
        int diff = p1[i] - p2[i];
        if (diff != 0) {
            return diff;
        }
    }
    return 0;
}